

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O1

void libtorrent::aux::move_file(string *inf,string *newf,storage_error *se)

{
  operation_t oVar1;
  bool bVar2;
  file_status s;
  string local_78;
  file_status local_58;
  
  (se->ec).val_ = 0;
  (se->ec).failed_ = false;
  (se->ec).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_58.mode.m_val = 0;
  local_58.mtime = 0;
  local_58.ctime = 0;
  local_58.file_size = 0;
  local_58.atime = 0;
  stat_file(inf,&local_58,&se->ec,(file_status_flag_t)0x0);
  oVar1 = file_stat;
  if ((se->ec).val_ == 0) {
    bVar2 = has_parent_path(newf);
    if (bVar2) {
      parent_path(&local_78,newf);
      create_directories(&local_78,&se->ec);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      oVar1 = mkdir;
      if ((se->ec).val_ != 0) goto LAB_00311635;
    }
    rename((libtorrent *)inf,(char *)newf,(char *)se);
    oVar1 = file_rename;
    if ((se->ec).val_ == 0) {
      return;
    }
  }
LAB_00311635:
  se->operation = oVar1;
  return;
}

Assistant:

void move_file(std::string const& inf, std::string const& newf, storage_error& se)
	{
		se.ec.clear();

		file_status s;
		stat_file(inf, &s, se.ec);
		if (se)
		{
			se.operation = operation_t::file_stat;
			return;
		}

		if (has_parent_path(newf))
		{
			create_directories(parent_path(newf), se.ec);
			if (se)
			{
				se.operation = operation_t::mkdir;
				return;
			}
		}

		rename(inf, newf, se.ec);
		if (se)
			se.operation = operation_t::file_rename;
	}